

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

void update_playing_effects(IT_PLAYING *playing)

{
  uchar *puVar1;
  int iVar2;
  IT_CHANNEL *pIVar3;
  byte bVar4;
  byte bVar5;
  
  pIVar3 = playing->channel;
  if (pIVar3->channelvolslide != '\0') {
    playing->channel_volume = pIVar3->channelvolume;
  }
  if (pIVar3->okt_toneslide == '\0') {
    if (pIVar3->ptm_toneslide != '\0') {
      puVar1 = &pIVar3->toneslide_tick;
      *puVar1 = *puVar1 + 0xff;
      if (*puVar1 == '\0') {
        pIVar3->toneslide_tick = pIVar3->ptm_toneslide;
        bVar4 = playing->note + (char)pIVar3->toneslide;
        bVar5 = 0x77;
        if (pIVar3->toneslide < 0) {
          bVar5 = 0;
        }
        if (0x77 < bVar4) {
          bVar4 = bVar5;
        }
        playing->note = bVar4;
        if (pIVar3->playing == playing) {
          pIVar3->truenote = bVar4;
          pIVar3->note = bVar4;
        }
        if (pIVar3->toneslide_retrig != '\0') {
          it_playing_reset_resamplers(playing,0);
          playing->declick_stage = '\0';
        }
      }
    }
  }
  else {
    pIVar3->okt_toneslide = pIVar3->okt_toneslide + 0xff;
    iVar2 = pIVar3->toneslide;
    bVar4 = playing->note + (char)iVar2;
    playing->note = bVar4;
    if (0x77 < bVar4) {
      if (iVar2 < 0) {
        playing->note = '\0';
      }
      else {
        playing->note = 'w';
      }
    }
  }
  return;
}

Assistant:

static void update_playing_effects(IT_PLAYING *playing)
{
	IT_CHANNEL *channel = playing->channel;

	if (channel->channelvolslide) {
		playing->channel_volume = channel->channelvolume;
	}

	if (channel->okt_toneslide) {
		if (channel->okt_toneslide--) {
			playing->note += channel->toneslide;
			if (playing->note >= 120) {
				if (channel->toneslide < 0) playing->note = 0;
				else playing->note = 119;
			}
		}
	} else if (channel->ptm_toneslide) {
		if (--channel->toneslide_tick == 0) {
			channel->toneslide_tick = channel->ptm_toneslide;
			if (playing) {
				playing->note += channel->toneslide;
				if (playing->note >= 120) {
					if (channel->toneslide < 0) playing->note = 0;
					else playing->note = 119;
				}
				if (channel->playing == playing) {
					channel->note = channel->truenote = playing->note;
				}
				if (channel->toneslide_retrig) {
					it_playing_reset_resamplers(playing, 0);
					playing->declick_stage = 0;
				}
			}
		}
	}
}